

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment.cpp
# Opt level: O2

clock_t experiment::randomExperiment(uint cashSize)

{
  pointer __first;
  pointer __last;
  uint uVar1;
  clock_t cVar2;
  clock_t cVar3;
  ulong uVar4;
  bool bVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2748;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2728;
  random_device local_13a0;
  
  uVar4 = (ulong)(cashSize << 8);
  local_2748._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2748._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
  local_2748._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
  for (local_2728._M_x[0]._0_4_ = 0; __last = local_2748._M_impl.super__Vector_impl_data._M_finish,
      __first = local_2748._M_impl.super__Vector_impl_data._M_start,
      (uint)local_2728._M_x[0] < cashSize << 8;
      local_2728._M_x[0]._0_4_ = (uint)local_2728._M_x[0] + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2748,
               (value_type *)&local_2728);
  }
  std::random_device::random_device(&local_13a0);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_2728,(ulong)uVar1);
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last,&local_2728);
  std::random_device::~random_device(&local_13a0);
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    rand();
  }
  cVar2 = clock();
  cVar3 = clock();
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2748);
  return cVar3 - cVar2;
}

Assistant:

clock_t experiment::randomExperiment(unsigned int cashSize)
{
    clock_t start, finish;
    int *a = new int[cashSize * 256];
    std::vector<unsigned int> index;
    for(unsigned int i = 0; i < cashSize * 256; ++i)
    {
        index.push_back(i);
    }
    std::shuffle(index.begin(), index.end(), std::mt19937(std::random_device()()));
    for(unsigned int i = 0; i < cashSize * 256; ++i)
    {
        a[i] = rand();
    }
    int newA = 0;
    start = clock();
    for(unsigned int i = 0; i < 1000; ++i)
    {
        for(unsigned int j = 0; j < cashSize * 256; ++j)
        {
            newA = a[index[j]];
        }
    }
    finish = clock();
    a[0]=newA;
    delete []a;
    return finish - start;
}